

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::CallExpression::createSystemCall
          (CallExpression *this,Compilation *compilation,SystemSubroutine *subroutine,
          Expression *firstArg,InvocationExpressionSyntax *syntax,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,SourceRange range,ASTContext *context,
          Scope *randomizeScope)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte *pbVar4;
  undefined4 uVar7;
  pointer ppEVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar6;
  PropertyExprSyntax *initialExpr;
  uint uVar8;
  undefined1 auVar9 [16];
  char **ppcVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  int iVar14;
  Symbol *pSVar15;
  undefined4 extraout_var;
  Diagnostic *pDVar16;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CallExpression *pCVar19;
  EmptyArgumentExpression *pEVar20;
  ExpressionSyntax *pEVar21;
  ulong uVar22;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar23;
  IteratorSymbol *pIVar24;
  undefined4 extraout_var_02;
  socklen_t __len;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *pEVar25;
  size_t extraout_RDX_03;
  Info *extraout_RDX_04;
  ASTContext *argContext_00;
  char *pcVar26;
  byte *pbVar27;
  ulong uVar28;
  SourceLocation SVar29;
  DiagCode code;
  DiagCode code_00;
  size_t sVar30;
  ulong uVar31;
  uint uVar32;
  Info *pIVar33;
  SyntaxNode *unaff_R12;
  long lVar34;
  variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *__v;
  SyntaxNode *pSVar35;
  value_type_pointer ppSVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  undefined1 auVar41 [16];
  SourceRange SVar42;
  undefined1 auVar43 [16];
  string_view arg;
  string_view arg_00;
  string_view indexMethodName;
  Token iteratorTok;
  string_view iteratorName;
  anon_class_8_1_bc11688f getId;
  SourceLocation iteratorLoc;
  ASTContext argContext;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  CallExpression *local_1e0;
  SystemSubroutine *local_1c8;
  CallExpression *local_1c0;
  RandomizeCallInfo local_1b8;
  ulong local_1a0;
  undefined1 local_198 [32];
  IteratorSymbol *local_178;
  Info *pIStack_170;
  undefined1 local_168 [16];
  ulong local_158;
  ulong local_150;
  SystemSubroutine *local_140;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_138;
  string_view local_100;
  SourceLocation local_f0;
  ASTContext local_e8;
  SmallVectorBase<const_slang::ast::Expression_*> local_b0 [2];
  Info *local_70;
  SourceLocation local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  Type *pTVar18;
  SystemSubroutine *this_00;
  
  local_60._8_8_ = *(undefined8 *)&(withClause->super_ExpressionSyntax).super_SyntaxNode;
  local_50._0_8_ = (Expression *)0x0;
  local_50._8_8_ = (ValueSymbol *)0x0;
  local_50._16_16_ = (undefined1  [16])0x0;
  local_b0[0].data_ = (pointer)local_b0[0].firstElement;
  local_b0[0].len = 0;
  local_b0[0].cap = 5;
  local_1c8 = subroutine;
  local_1c0 = (CallExpression *)firstArg;
  local_60._0_8_ = compilation;
  if (subroutine != (SystemSubroutine *)0x0) {
    SmallVectorBase<slang::ast::Expression_const*>::
    emplace_back<slang::ast::Expression_const*const&>
              ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,(Expression **)&local_1c8)
    ;
  }
  if ((compilation->options).maxRecursiveClassSpecialization == 1) {
    if (syntax == (InvocationExpressionSyntax *)0x0) {
      if (((local_1c0 == (CallExpression *)0x0) ||
          (pSVar35 = *(SyntaxNode **)
                      ((long)&(local_1c0->subroutine).
                              super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      + 0x28), pSVar35 == (SyntaxNode *)0x0)) ||
         (pSVar35[3].previewNode == (SyntaxNode *)0x0)) goto LAB_0041f9cb;
      SVar42 = slang::syntax::SyntaxNode::sourceRange(pSVar35);
      pDVar16 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x680007,SVar42);
      Diagnostic::operator<<(pDVar16,(string *)&(compilation->super_BumpAllocator).endPtr);
      this_00 = (SystemSubroutine *)0x0;
    }
    else {
      if (local_1c8 == (SystemSubroutine *)0x0) {
LAB_0041f9cb:
        this_00 = (SystemSubroutine *)0x0;
        goto LAB_0041fcb5;
      }
      pSVar35 = (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode;
      if (pSVar35 == (SyntaxNode *)0x0) {
        pSVar35 = (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.parent;
        if (pSVar35 == (SyntaxNode *)0x0) {
          SVar42 = parsing::Token::range((Token *)&syntax->attributes);
LAB_0042025f:
          code_00.subsystem = Expressions;
          code_00.code = 0x52;
          goto LAB_00420267;
        }
        if (((ulong)((long)&(pSVar35[3].previewNode)->kind + 1) & 0xfffffffffffffffe) != 2) {
          SVar42 = slang::syntax::SyntaxNode::sourceRange(pSVar35);
          goto LAB_0042025f;
        }
        pbVar4 = (compilation->super_BumpAllocator).endPtr;
        uVar3 = (compilation->options).flags;
        uVar7 = (compilation->options).maxInstanceDepth;
        arg._M_len._4_4_ = uVar7;
        arg._M_len._0_4_ = uVar3;
        pTVar18 = (Type *)(local_1c8->name)._M_dataplus._M_p;
        local_f0 = (SourceLocation)0xffffffffffffffff;
        local_138.len = (long)"expected case item" + 0xe;
        local_138.data_ = (pointer)0x4;
        local_1b8.constraintRestrictions._M_ptr = (pointer)"index";
        local_1b8.inlineConstraints = (Constraint *)0x5;
        if (((local_1c0 != (CallExpression *)0x0) &&
            (pSVar35 = *(SyntaxNode **)
                        ((long)&(local_1c0->subroutine).
                                super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                .
                                super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                .
                                super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                .
                                super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                .
                                super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                .
                                super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        + 0x28), pSVar35 != (SyntaxNode *)0x0)) &&
           (pSVar35[3].previewNode != (SyntaxNode *)0x0)) {
          pbVar27 = (byte *)((long)&(pSVar35[3].previewNode)->kind + 1);
          if (pbVar27 < (byte *)0x6) {
            pSVar35 = pSVar35[3].parent;
            local_100._M_len = (size_t)withClause;
            ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)pSVar35);
            local_198._0_16_ =
                 (undefined1  [16])
                 getIteratorParams::anon_class_8_1_bc11688f::operator()
                           ((anon_class_8_1_bc11688f *)&local_100,(ArgumentSyntax *)*ppSVar23);
            if ((local_198._8_8_ != (Info *)0x0) &&
               ((local_198._0_16_ & (undefined1  [16])0x10000) == (undefined1  [16])0x0)) {
              if ((byte *)0x3 < pbVar27) {
                pSVar35 = pSVar35 + 2;
                ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                     ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       *)pSVar35);
                local_e8._0_16_ =
                     getIteratorParams::anon_class_8_1_bc11688f::operator()
                               ((anon_class_8_1_bc11688f *)&local_100,(ArgumentSyntax *)*ppSVar23);
                if ((local_e8._8_8_ == (Info *)0x0) ||
                   (((undefined1  [16])local_e8._0_16_ & (undefined1  [16])0x10000) !=
                    (undefined1  [16])0x0)) goto LAB_00420274;
                local_1b8._0_16_ = parsing::Token::valueText((Token *)&local_e8);
                iVar14 = *(int *)(**(long **)&(withClause->super_ExpressionSyntax).super_SyntaxNode
                                 + 0x48);
                if (iVar14 < 1) {
                  ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         *)pSVar35);
                  SVar42 = slang::syntax::SyntaxNode::sourceRange(*ppSVar23);
                  pDVar16 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x20001,SVar42);
                  sVar30 = 9;
                  if (iVar14 == 0) {
                    pcVar26 = "1800-2017";
                  }
                  else if (iVar14 == 1) {
                    pcVar26 = "1800-2023";
                  }
                  else {
                    pcVar26 = "";
                    sVar30 = 0;
                  }
                  arg_00._M_str = pcVar26;
                  arg_00._M_len = sVar30;
                  Diagnostic::operator<<(pDVar16,arg_00);
                }
              }
              local_138._0_16_ = parsing::Token::valueText((Token *)local_198);
              local_f0 = parsing::Token::location((Token *)local_198);
              goto LAB_00420421;
            }
          }
          else {
            SVar42 = slang::syntax::SyntaxNode::sourceRange(pSVar35);
            pDVar16 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0xa00007,SVar42);
            arg._M_str = (char *)pbVar4;
            Diagnostic::operator<<(pDVar16,arg);
            local_198._0_8_ = (Scope *)0x2;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<long>(&pDVar16->args,(long *)local_198);
            local_198._0_8_ = (ulong)pbVar27 >> 1;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<unsigned_long>(&pDVar16->args,(unsigned_long *)local_198);
          }
          goto LAB_00420274;
        }
LAB_00420421:
        pIVar24 = BumpAllocator::
                  emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Type_const&,std::basic_string_view<char,std::char_traits<char>>&>
                            ((BumpAllocator *)this,
                             *(Scope **)&(withClause->super_ExpressionSyntax).super_SyntaxNode,
                             (basic_string_view<char,_std::char_traits<char>_> *)&local_138,
                             &local_f0,pTVar18,
                             (basic_string_view<char,_std::char_traits<char>_> *)&local_1b8);
        local_198._0_16_ =
             *(undefined1 (*) [16])&(withClause->super_ExpressionSyntax).super_SyntaxNode;
        pSVar35 = (withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode;
        local_198._24_8_ = (withClause->method).ptr;
        pIStack_170 = (withClause->with).info;
        local_168._0_8_ = withClause->args;
        (pIVar24->super_TempVarSymbol).nextTemp = *(TempVarSymbol **)&withClause->with;
        local_198._16_8_ = (pointer)((ulong)pSVar35 & 0x1fffffffffbf);
        local_178 = pIVar24;
        ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.parent[3].
                              parent);
        iVar14 = Expression::bind((int)*ppSVar23,(sockaddr *)local_198,0);
        this_00 = (SystemSubroutine *)CONCAT44(extraout_var_02,iVar14);
      }
      else {
        SVar42 = slang::syntax::SyntaxNode::sourceRange(pSVar35);
        code_00.subsystem = Expressions;
        code_00.code = 0xa4;
LAB_00420267:
        ASTContext::addDiag((ASTContext *)withClause,code_00,SVar42);
LAB_00420274:
        pIVar24 = (IteratorSymbol *)0x0;
        this_00 = (SystemSubroutine *)0x0;
      }
      if ((this_00 != (SystemSubroutine *)0x0) &&
         (bVar13 = Expression::bad((Expression *)this_00), !bVar13)) {
        local_198._8_8_ = pIVar24;
        local_198._0_8_ = this_00;
        std::
        variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
        ::operator=((variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                     *)local_50,(IteratorCallInfo *)local_198);
        goto LAB_0041fcb5;
      }
    }
    local_1e0 = (CallExpression *)Expression::badExpr((Compilation *)this,(Expression *)this_00);
  }
  else {
    local_198._16_8_ = (pointer)0x0;
    local_198._24_8_ = 0;
    local_198._0_2_ = Unknown;
    local_198[2] = 0;
    local_198[3] = '\0';
    local_198._4_4_ = 0;
    local_198._8_8_ = (Info *)0x0;
    local_178 = (IteratorSymbol *)0x3f;
    pIStack_170 = (Info *)0x1;
    local_168 = ZEXT816(0x47fac0);
    local_158 = 0;
    local_150 = 0;
    ASTContext::resetFlags(&local_e8,(ASTContext *)withClause,(bitmask<slang::ast::ASTFlags>)0x0);
    pEVar25 = extraout_RDX;
    if ((compilation->options).maxRecursiveClassSpecialization == 2) {
      local_e8.randomizeDetails = (RandomizeDetails *)local_198;
      if (local_1c8 == (SystemSubroutine *)0x0) {
        this_00 = local_1c8;
        if ((context != (ASTContext *)0x0) && (**(int **)&context->lookupIndex == 0x16)) {
          local_198._0_8_ = context;
        }
      }
      else {
        pTVar18 = (Type *)(local_1c8->name)._M_dataplus._M_p;
        if (pTVar18->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
        }
        local_198._0_8_ = pTVar18->canonical + 1;
        pSVar15 = Expression::getSymbolReference((Expression *)local_1c8,true);
        local_198._8_8_ = pSVar15;
        pEVar25 = extraout_RDX_00;
        this_00 = local_1c8;
      }
    }
    else {
      this_00 = (SystemSubroutine *)0x0;
    }
    if (syntax == (InvocationExpressionSyntax *)0x0) {
LAB_0041fbb3:
      pCVar19 = local_1c0;
      if ((local_1c0 != (CallExpression *)0x0) &&
         (pCVar19 = *(CallExpression **)
                     ((long)&(local_1c0->subroutine).
                             super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     + 0x28), pCVar19 != (CallExpression *)0x0)) {
        uVar28 = *(long *)((long)&(pCVar19->subroutine).
                                  super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          + 0x28) + 1;
        uVar22 = CONCAT71((int7)((ulong)unaff_R12 >> 8),uVar28 < 2);
        local_140 = this_00;
        if (uVar28 >= 2) {
          __v = *(variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> **)
                 ((long)&(pCVar19->subroutine).
                         super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 + 0x20);
          uVar31 = 0;
          do {
            lVar34 = (uVar31 + 1) - (ulong)(local_1c8 == (SystemSubroutine *)0x0);
            ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
            if ((*ppSVar23)->kind == EmptyArgument) {
              cVar12 = (*(code *)(compilation->super_BumpAllocator).head[1].prev)
                                 (compilation,lVar34);
              if (cVar12 == '\0') {
                ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v)
                ;
                SVar42 = slang::syntax::SyntaxNode::sourceRange(*ppSVar23);
                code.subsystem = Expressions;
                code.code = 0x4d;
                goto LAB_0041ff91;
              }
              pTVar18 = (Type *)this[2].thisClass_;
              ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
              local_138._0_16_ = slang::syntax::SyntaxNode::sourceRange(*ppSVar23);
              pEVar20 = BumpAllocator::
                        emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                                  ((BumpAllocator *)this,pTVar18,(SourceRange *)&local_138);
              local_1b8.inlineConstraints = (Constraint *)pEVar20;
              pCVar19 = (CallExpression *)
                        SmallVectorBase<slang::ast::Expression_const*>::
                        emplace_back<slang::ast::Expression_const*>
                                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,
                                   (Expression **)&local_1b8);
LAB_0041ff75:
              bVar13 = true;
            }
            else if ((*ppSVar23)->kind == NamedArgument) {
              ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
              SVar42 = slang::syntax::SyntaxNode::sourceRange(*ppSVar23);
              code.subsystem = Expressions;
              code.code = 0x79;
LAB_0041ff91:
              ASTContext::addDiag(&local_e8,code,SVar42);
              bVar13 = false;
              pCVar19 = (CallExpression *)Expression::badExpr((Compilation *)this,(Expression *)0x0)
              ;
              local_1e0 = pCVar19;
            }
            else {
              ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
              pSVar6 = *ppSVar23;
              initialExpr = *(PropertyExprSyntax **)(pSVar6 + 1);
              if ((initialExpr->super_SyntaxNode).kind == ClockingPropertyExpr) {
                cVar12 = (*(code *)(compilation->super_BumpAllocator).head[1].current)
                                   (compilation,lVar34);
                if (cVar12 != '\0') {
                  SVar29 = (SourceLocation)
                           ClockingEventExpression::fromSyntax
                                     (*(ClockingEventExpression **)(pSVar6 + 1),
                                      (ClockingPropertyExprSyntax *)&local_e8,argContext_00);
                  local_138.data_ = (pointer)SVar29;
                  pCVar19 = (CallExpression *)
                            SmallVectorBase<slang::ast::Expression_const*>::
                            emplace_back<slang::ast::Expression_const*>
                                      ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,
                                       (Expression **)&local_138);
                  goto LAB_0041ff75;
                }
                ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v)
                ;
                SVar42 = slang::syntax::SyntaxNode::sourceRange(*ppSVar23);
                ASTContext::addDiag(&local_e8,(DiagCode)0x9e0007,SVar42);
                bVar13 = false;
                pCVar19 = (CallExpression *)
                          Expression::badExpr((Compilation *)this,(Expression *)0x0);
                local_1e0 = pCVar19;
              }
              else {
                pEVar21 = ASTContext::requireSimpleExpr((ASTContext *)withClause,initialExpr);
                bVar13 = pEVar21 != (ExpressionSyntax *)0x0;
                if (pEVar21 == (ExpressionSyntax *)0x0) {
                  pCVar19 = (CallExpression *)
                            Expression::badExpr((Compilation *)this,(Expression *)0x0);
                  local_1e0 = pCVar19;
                }
                else {
                  local_138.len = local_b0[0].len;
                  local_138.data_ = (pointer)local_b0[0].data_;
                  sVar30 = (*(code *)(compilation->super_BumpAllocator).head[2].current)
                                     (compilation,lVar34,(Token *)&local_e8,pEVar21,
                                      (string_view *)&local_138);
                  local_1b8.inlineConstraints = (Constraint *)sVar30;
                  pCVar19 = (CallExpression *)
                            SmallVectorBase<slang::ast::Expression_const*>::
                            emplace_back<slang::ast::Expression_const*>
                                      ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,
                                       (Expression **)&local_1b8);
                }
              }
            }
            if (!bVar13) break;
            uVar31 = uVar31 + 1;
            uVar22 = CONCAT71((int7)(uVar22 >> 8),uVar28 >> 1 <= uVar31);
            __v = __v + 2;
          } while (uVar28 >> 1 != uVar31);
        }
        this_00 = local_140;
        local_1a0 = uVar22;
        if ((char)uVar22 == '\0') goto LAB_0041fc7a;
      }
      local_1a0 = CONCAT71((int7)((ulong)pCVar19 >> 8),1);
      if (syntax != (InvocationExpressionSyntax *)0x0) {
        local_140 = this_00;
        if (((Scope *)local_198._0_8_ == (Scope *)0x0) &&
           ((SourceLocation)local_b0[0].len != (SourceLocation)0x0)) {
          local_68 = (SourceLocation)((long)local_b0[0].data_ + local_b0[0].len * 8);
          SVar29 = (SourceLocation)local_b0[0].data_;
          do {
            pSVar15 = Expression::getSymbolReference(*(Expression **)SVar29,true);
            local_1b8.inlineConstraints = (Constraint *)pSVar15;
            if (pSVar15 != (Symbol *)0x0) {
              auVar43._8_8_ = 0;
              auVar43._0_8_ = pSVar15;
              uVar31 = SUB168(auVar43 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                       SUB168(auVar43 * ZEXT816(0x9e3779b97f4a7c15),0);
              uVar22 = uVar31 >> ((byte)local_178._0_1_ & 0x3f);
              uVar2 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar31 & 0xff];
              local_70 = pIStack_170;
              pIVar33 = (Info *)0x0;
              uVar28 = uVar22;
              do {
                pgVar1 = (group_type_pointer)(local_168._0_8_ + uVar28 * 0x10);
                uVar37 = (uchar)uVar2;
                auVar41[0] = -(pgVar1->m[0].n == uVar37);
                uVar38 = (uchar)((uint)uVar2 >> 8);
                auVar41[1] = -(pgVar1->m[1].n == uVar38);
                uVar39 = (uchar)((uint)uVar2 >> 0x10);
                auVar41[2] = -(pgVar1->m[2].n == uVar39);
                uVar40 = (uchar)((uint)uVar2 >> 0x18);
                auVar41[3] = -(pgVar1->m[3].n == uVar40);
                auVar41[4] = -(pgVar1->m[4].n == uVar37);
                auVar41[5] = -(pgVar1->m[5].n == uVar38);
                auVar41[6] = -(pgVar1->m[6].n == uVar39);
                auVar41[7] = -(pgVar1->m[7].n == uVar40);
                auVar41[8] = -(pgVar1->m[8].n == uVar37);
                auVar41[9] = -(pgVar1->m[9].n == uVar38);
                auVar41[10] = -(pgVar1->m[10].n == uVar39);
                auVar41[0xb] = -(pgVar1->m[0xb].n == uVar40);
                auVar41[0xc] = -(pgVar1->m[0xc].n == uVar37);
                auVar41[0xd] = -(pgVar1->m[0xd].n == uVar38);
                auVar41[0xe] = -(pgVar1->m[0xe].n == uVar39);
                auVar41[0xf] = -(pgVar1->m[0xf].n == uVar40);
                for (uVar32 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                            (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
                    uVar32 != 0; uVar32 = uVar32 - 1 & uVar32) {
                  uVar8 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                    }
                  }
                  if (pSVar15 ==
                      *(value_type_pointer)(local_168._8_8_ + (uVar28 * 0xf + (ulong)uVar8) * 8)) {
                    ppSVar36 = (value_type_pointer)
                               (local_168._8_8_ + (uVar28 * 0xf + (ulong)uVar8) * 8);
                    goto LAB_004201cb;
                  }
                }
                if ((((group_type_pointer)(local_168._0_8_ + uVar28 * 0x10))->m[0xf].n &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[(uint)uVar31 & 7]) == 0) break;
                ppcVar10 = &pIVar33->rawTextPtr;
                pIVar33 = (Info *)((long)&pIVar33->rawTextPtr + 1);
                uVar28 = (long)ppcVar10 + uVar28 + 1 & (ulong)pIStack_170;
              } while (pIVar33 <= pIStack_170);
              ppSVar36 = (value_type_pointer)0x0;
LAB_004201cb:
              if (ppSVar36 == (value_type_pointer)0x0) {
                if (local_150 < local_158) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                  ::nosize_unchecked_emplace_at<slang::ast::Symbol_const*&>
                            ((locator *)&local_138,
                             (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                              *)&local_178,(arrays_type *)&local_178,uVar22,uVar31,
                             (Symbol **)&local_1b8);
                  local_150 = local_150 + 1;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                  ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*&>
                            ((locator *)&local_138,
                             (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                              *)&local_178,uVar31,(Symbol **)&local_1b8);
                }
              }
            }
            SVar29 = (SourceLocation)((long)SVar29 + 8);
          } while (SVar29 != local_68);
        }
        pvVar17 = std::
                  get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                            ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                              *)local_50);
        local_198._16_16_ = *(undefined1 (*) [16])&pvVar17->constraintRestrictions;
        iVar14 = Constraint::bind((int)(syntax->attributes).super_SyntaxListBase.super_SyntaxNode.
                                       previewNode,(sockaddr *)&local_e8,__len);
        pvVar17->inlineConstraints = (Constraint *)CONCAT44(extraout_var_00,iVar14);
        this_00 = local_140;
      }
    }
    else {
      if ((compilation->options).maxRecursiveClassSpecialization == 2) {
        if ((syntax->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode !=
            (SyntaxNode *)0x0) {
          local_1b8.inlineConstraints = (Constraint *)0x0;
          local_1b8.constraintRestrictions._M_ptr = (pointer)0x0;
          local_1b8.constraintRestrictions._M_extent._M_extent_value = 0;
          unaff_R12 = (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.parent;
          if (unaff_R12 == (SyntaxNode *)0x0) {
LAB_0041f965:
            std::
            variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
            ::operator=((variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         *)local_50,&local_1b8);
            bVar13 = true;
          }
          else {
            if ((local_e8.randomizeDetails != (RandomizeDetails *)0x0) &&
               ((local_e8.randomizeDetails)->classType != (Scope *)0x0)) {
              local_138.len = 0;
              local_138.data_ = (string_view *)local_138.firstElement;
              local_138.cap = 2;
              pbVar27 = (byte *)((long)&(unaff_R12[3].previewNode)->kind + 1);
              if ((byte *)0x1 < pbVar27) {
                uVar28 = (ulong)pbVar27 >> 1;
                lVar34 = 0;
                do {
                  ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         *)((long)&(unaff_R12[3].parent)->kind + lVar34));
                  pSVar35 = *ppSVar23;
                  if (pSVar35->kind == IdentifierName) {
                    local_100 = parsing::Token::valueText((Token *)(pSVar35 + 1));
                    SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
                    emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                              ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>
                                *)&local_138,&local_100);
                    pEVar25 = extraout_RDX_01;
                  }
                  else {
                    SVar42 = slang::syntax::SyntaxNode::sourceRange(pSVar35);
                    ASTContext::addDiag(&local_e8,(DiagCode)0x410005,SVar42);
                    pEVar25 = extraout_RDX_02;
                  }
                  lVar34 = lVar34 + 0x30;
                  uVar28 = uVar28 - 1;
                } while (uVar28 != 0);
              }
              iVar14 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::copy
                                 (&local_138,(EVP_PKEY_CTX *)(local_e8.scope.ptr)->compilation,
                                  pEVar25);
              auVar43 = (undefined1  [16])local_1b8._0_16_;
              local_1b8.constraintRestrictions._M_ptr._4_4_ = extraout_var;
              local_1b8.constraintRestrictions._M_ptr._0_4_ = iVar14;
              local_1b8.inlineConstraints = auVar43._0_8_;
              local_1b8.constraintRestrictions._M_extent._M_extent_value = extraout_RDX_03;
              if (local_138.data_ != (string_view *)local_138.firstElement) {
                operator_delete(local_138.data_);
              }
              goto LAB_0041f965;
            }
            SVar42 = slang::syntax::SyntaxNode::sourceRange(unaff_R12);
            ASTContext::addDiag(&local_e8,(DiagCode)0x780007,SVar42);
            bVar13 = false;
            local_1e0 = (CallExpression *)Expression::badExpr((Compilation *)this,(Expression *)0x0)
            ;
          }
          if (bVar13) goto LAB_0041fbb3;
          local_1a0 = 0;
          goto LAB_0041fc7a;
        }
        SVar42 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag(&local_e8,(DiagCode)0x6d0007,SVar42);
      }
      else {
        SVar42 = parsing::Token::range((Token *)&syntax->attributes);
        pDVar16 = ASTContext::addDiag(&local_e8,(DiagCode)0xad0007,SVar42);
        Diagnostic::operator<<(pDVar16,(string *)&(compilation->super_BumpAllocator).endPtr);
      }
      local_1a0 = 0;
      local_1e0 = (CallExpression *)Expression::badExpr((Compilation *)this,(Expression *)0x0);
    }
LAB_0041fc7a:
    if ((value_type_pointer)local_168._8_8_ != (value_type_pointer)0x0) {
      operator_delete((void *)local_168._8_8_,(long)pIStack_170 * 0x88 + 0x90);
    }
    if ((local_1a0 & 1) == 0) goto LAB_0042029b;
LAB_0041fcb5:
    local_198._0_8_ = local_b0[0].data_;
    local_198._8_8_ = local_b0[0].len;
    auVar43 = (*(code *)(compilation->super_BumpAllocator).head[3].current)
                        (compilation,withClause,local_198,range.startLoc,range.endLoc,this_00);
    pTVar18 = auVar43._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_138.len;
    local_138._0_16_ = auVar9 << 0x40;
    local_198._0_4_ =
         SmallVectorBase<const_slang::ast::Expression_*>::copy
                   (local_b0,(EVP_PKEY_CTX *)this,auVar43._8_8_);
    local_198._4_4_ = extraout_var_01;
    SVar29 = (SourceLocation)local_198;
    local_198._8_8_ = extraout_RDX_04;
    local_e8._0_12_ = *(undefined1 (*) [12])&(withClause->super_ExpressionSyntax).super_SyntaxNode;
    pCVar19 = BumpAllocator::
              emplace<slang::ast::CallExpression,slang::ast::CallExpression::SystemCallInfo&,slang::ast::Type_const&,decltype(nullptr),std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::LookupLocation,slang::SourceRange&>
                        ((BumpAllocator *)this,(SystemCallInfo *)local_60,pTVar18,
                         (void **)&local_138,
                         (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)SVar29,
                         (LookupLocation *)&local_e8,&range);
    if (pTVar18->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar18);
    }
    if ((pTVar18->canonical->super_Symbol).kind == ErrorType) {
      local_1e0 = (CallExpression *)
                  Expression::badExpr((Compilation *)this,&pCVar19->super_Expression);
    }
    else {
      sVar30 = (pCVar19->arguments_)._M_extent._M_extent_value;
      bVar13 = sVar30 == 0;
      if (!bVar13) {
        ppEVar5 = (pCVar19->arguments_)._M_ptr;
        lVar34 = 0;
        do {
          bVar11 = Expression::bad(*(Expression **)((long)ppEVar5 + lVar34));
          if (bVar11) {
            local_1e0 = (CallExpression *)
                        Expression::badExpr((Compilation *)this,&pCVar19->super_Expression);
            break;
          }
          lVar34 = lVar34 + 8;
          bVar13 = sVar30 << 3 == lVar34;
        } while (!bVar13);
      }
      if (bVar13) {
        SVar42.endLoc = SVar29;
        SVar42.startLoc = range.endLoc;
        bVar13 = checkOutputArgs((ast *)withClause,
                                 (ASTContext *)(ulong)(byte)(compilation->options).maxInstanceArray,
                                 range.startLoc._0_1_,SVar42);
        if (bVar13) {
          local_1e0 = pCVar19;
          if (local_1c0 != (CallExpression *)0x0) {
            ASTContext::setAttributes
                      ((ASTContext *)withClause,&pCVar19->super_Expression,
                       *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                         *)((long)&(local_1c0->subroutine).
                                   super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                   .
                                   super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                   .
                                   super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                   .
                                   super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                   .
                                   super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                   .
                                   super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                           + 0x18));
          }
        }
        else {
          local_1e0 = (CallExpression *)
                      Expression::badExpr((Compilation *)this,&pCVar19->super_Expression);
        }
      }
    }
  }
LAB_0042029b:
  if (local_b0[0].data_ != (pointer)local_b0[0].firstElement) {
    operator_delete(local_b0[0].data_);
  }
  return &local_1e0->super_Expression;
}

Assistant:

Expression& CallExpression::createSystemCall(
    Compilation& compilation, const SystemSubroutine& subroutine, const Expression* firstArg,
    const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, SourceRange range,
    const ASTContext& context, const Scope* randomizeScope) {

    SystemCallInfo callInfo{&subroutine, context.scope, {}};
    SmallVector<const Expression*> buffer;
    if (firstArg)
        buffer.push_back(firstArg);

    const Expression* iterOrThis = nullptr;
    const ValueSymbol* iterVar = nullptr;
    using WithClauseMode = SystemSubroutine::WithClauseMode;
    if (subroutine.withClauseMode == WithClauseMode::Iterator) {
        // 'with' clause is not required. If it's not there, no arguments
        // can be provided.
        if (!withClause) {
            if (syntax && syntax->arguments && !syntax->arguments->parameters.empty()) {
                context.addDiag(diag::IteratorArgsWithoutWithClause,
                                syntax->arguments->sourceRange())
                    << subroutine.name;
                return badExpr(compilation, nullptr);
            }
        }
        else if (firstArg) {
            iterOrThis = bindIteratorExpr(compilation, subroutine.name, syntax, *withClause,
                                          *firstArg->type, context, iterVar);
            if (!iterOrThis || iterOrThis->bad())
                return badExpr(compilation, iterOrThis);

            callInfo.extraInfo = IteratorCallInfo{iterOrThis, iterVar};
        }
    }
    else {
        ASTContext::RandomizeDetails randomizeDetails;
        ASTContext argContext = context.resetFlags({});

        if (subroutine.withClauseMode == WithClauseMode::Randomize) {
            // If this is a class-scoped randomize call, setup the scope properly
            // so that class members can be found in the constraint block.
            argContext.randomizeDetails = &randomizeDetails;
            if (firstArg) {
                randomizeDetails.classType = &firstArg->type->getCanonicalType().as<ClassType>();
                randomizeDetails.thisVar = firstArg->getSymbolReference();
            }
            else if (randomizeScope && randomizeScope->asSymbol().kind == SymbolKind::ClassType) {
                randomizeDetails.classType = randomizeScope;
            }
            iterOrThis = firstArg;
        }

        if (withClause) {
            if (subroutine.withClauseMode == WithClauseMode::Randomize) {
                if (!withClause->constraints) {
                    argContext.addDiag(diag::MissingConstraintBlock, withClause->sourceRange());
                    return badExpr(compilation, nullptr);
                }

                RandomizeCallInfo randInfo;
                if (withClause->args) {
                    if (!argContext.randomizeDetails || !argContext.randomizeDetails->classType) {
                        argContext.addDiag(diag::NameListWithScopeRandomize,
                                           withClause->args->sourceRange());
                        return badExpr(compilation, nullptr);
                    }

                    SmallVector<std::string_view> names;
                    for (auto expr : withClause->args->expressions) {
                        if (expr->kind != SyntaxKind::IdentifierName) {
                            argContext.addDiag(diag::ExpectedIdentifier, expr->sourceRange());
                            continue;
                        }

                        names.push_back(expr->as<IdentifierNameSyntax>().identifier.valueText());
                    }

                    randInfo.constraintRestrictions = names.copy(argContext.getCompilation());
                }

                callInfo.extraInfo = randInfo;
            }
            else {
                argContext.addDiag(diag::WithClauseNotAllowed, withClause->with.range())
                    << subroutine.name;
                return badExpr(compilation, nullptr);
            }
        }

        // Bind arguments as we would for any ordinary method.
        if (syntax && syntax->arguments) {
            auto actualArgs = syntax->arguments->parameters;
            for (size_t i = 0; i < actualArgs.size(); i++) {
                size_t index = i + (firstArg ? 1 : 0);
                switch (actualArgs[i]->kind) {
                    case SyntaxKind::OrderedArgument: {
                        const auto& arg = actualArgs[i]->as<OrderedArgumentSyntax>();
                        if (arg.expr->kind == SyntaxKind::ClockingPropertyExpr) {
                            if (subroutine.allowClockingArgument(index)) {
                                buffer.push_back(&ClockingEventExpression::fromSyntax(
                                    arg.expr->as<ClockingPropertyExprSyntax>(), argContext));
                            }
                            else {
                                argContext.addDiag(diag::TimingControlNotAllowed,
                                                   actualArgs[i]->sourceRange());
                                return badExpr(compilation, nullptr);
                            }
                        }
                        else if (auto exSyn = context.requireSimpleExpr(*arg.expr)) {
                            buffer.push_back(
                                &subroutine.bindArgument(index, argContext, *exSyn, buffer));
                        }
                        else {
                            return badExpr(compilation, nullptr);
                        }
                        break;
                    }
                    case SyntaxKind::NamedArgument:
                        argContext.addDiag(diag::NamedArgNotAllowed, actualArgs[i]->sourceRange());
                        return badExpr(compilation, nullptr);
                    case SyntaxKind::EmptyArgument:
                        if (subroutine.allowEmptyArgument(index)) {
                            buffer.push_back(compilation.emplace<EmptyArgumentExpression>(
                                compilation.getVoidType(), actualArgs[i]->sourceRange()));
                        }
                        else {
                            argContext.addDiag(diag::EmptyArgNotAllowed,
                                               actualArgs[i]->sourceRange());
                            return badExpr(compilation, nullptr);
                        }
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
        }

        if (withClause) {
            // Finally bind the inline constraint block if we have one.
            SLANG_ASSERT(withClause->constraints);

            // For scope randomize calls we need to register the
            // arg variables so they get treated as 'rand'.
            if (!randomizeDetails.classType) {
                for (auto arg : buffer) {
                    auto sym = arg->getSymbolReference();
                    if (sym)
                        randomizeDetails.scopeRandVars.emplace(sym);
                }
            }

            auto& randInfo = std::get<2>(callInfo.extraInfo);
            randomizeDetails.nameRestrictions = randInfo.constraintRestrictions;
            randInfo.inlineConstraints = &Constraint::bind(*withClause->constraints, argContext);
        }
    }

    const Type& type = subroutine.checkArguments(context, buffer, range, iterOrThis);
    auto expr = compilation.emplace<CallExpression>(callInfo, type, nullptr,
                                                    buffer.copy(compilation), context.getLocation(),
                                                    range);

    if (type.isError())
        return badExpr(compilation, expr);

    for (auto arg : expr->arguments()) {
        if (arg->bad())
            return badExpr(compilation, expr);
    }

    if (!checkOutputArgs(context, subroutine.hasOutputArgs, range))
        return badExpr(compilation, expr);

    if (syntax)
        context.setAttributes(*expr, syntax->attributes);

    return *expr;
}